

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O0

void supfind1(errcxdef *ec,toktdef *tab,char *nam,objnum *objp,int required,int *errp,int warnlevel,
             int casefold)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RCX;
  errcxdef *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  undefined4 *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  char buf [40];
  int namel;
  toksdef sym;
  int err;
  char *in_stack_ffffffffffffff50;
  errcxdef *ctx;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  errcxdef *ctx_00;
  undefined1 local_98 [116];
  int local_24;
  char *local_20;
  errcxdef *local_18;
  long local_10;
  long *local_8;
  
  local_98._104_8_ = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar3 = strlen((char *)in_RDX);
  local_98._52_4_ = (undefined4)sVar3;
  if (in_stack_00000010 != 0) {
    strcpy(local_98,(char *)local_18);
    os_strlwr(in_stack_ffffffffffffff50);
    local_18 = (errcxdef *)local_98;
  }
  ctx_00 = *(errcxdef **)(local_10 + 8);
  ctx = local_18;
  uVar5 = local_98._52_4_;
  uVar1 = tokhsh((char *)local_18);
  iVar2 = (*(code *)ctx_00)(local_10,ctx,uVar5,uVar1,local_98 + 0x3a);
  err = (int)((ulong)local_10 >> 0x20);
  if (iVar2 == 0) {
    if ((local_24 != 0) || (1 < in_stack_00000008)) {
      pcVar4 = errstr(ctx_00,(char *)CONCAT44(uVar5,in_stack_ffffffffffffff58),
                      (int)((ulong)ctx >> 0x20));
      *(char **)(*local_8 + 0x18) = pcVar4;
      *(undefined4 *)(*local_8 + 0x68) = 1;
      errlogn(ctx,err,(char *)0x125889);
    }
    local_20[0] = -1;
    local_20[1] = -1;
    if (local_24 != 0) {
      *(undefined4 *)local_98._104_8_ = 1;
    }
  }
  else {
    *(undefined2 *)local_20 = local_98._60_2_;
  }
  return;
}

Assistant:

static void supfind1(errcxdef *ec, toktdef *tab, char *nam, objnum *objp,
                     int required, int *errp, int warnlevel, int casefold)
{
    toksdef sym;
    int     namel = strlen(nam);
    char    buf[40];

    if (casefold)
    {
        strcpy(buf, nam);
        os_strlwr(buf);
        nam = buf;
    }
    if ((*tab->toktfsea)(tab, nam, namel, tokhsh(nam), &sym))
    {
        *objp = (objnum)sym.toksval;
    }
    else
    {
        if (required || warnlevel > 1)
            errlog1(ec, (required ? ERR_RQOBJNF : ERR_WRNONF),
                    ERRTSTR, errstr(ec, nam, namel));
        *objp = MCMONINV;
        if (required) *errp = 1;
    }
}